

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void __thiscall SQCompilation::CheckerVisitor::checkPlusString(CheckerVisitor *this,BinExpr *bin)

{
  TreeOp TVar1;
  bool bVar2;
  bool bVar3;
  Expr *e;
  Expr *e_00;
  int32_t dummy;
  int32_t dummy_1;
  int32_t local_30 [2];
  
  if ((this->effectsOnly == false) &&
     ((TVar1 = (bin->super_Expr).super_Node._op, TVar1 == TO_PLUSEQ || (TVar1 == TO_ADD)))) {
    local_30[0] = -1;
    e = maybeEval(this,bin->_lhs,local_30,false);
    local_30[1] = 0xffffffff;
    e_00 = maybeEval(this,bin->_rhs,local_30 + 1,false);
    bVar2 = couldBeString(this,e);
    bVar3 = couldBeString(this,e_00);
    if (bVar2 != bVar3) {
      report(this,(Node *)bin,0x6a);
      return;
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkPlusString(const BinExpr *bin) {
  if (effectsOnly)
    return;

  if (bin->op() != TO_ADD && bin->op() != TO_PLUSEQ)
    return;

  const Expr *l = maybeEval(bin->lhs());
  const Expr *r = maybeEval(bin->rhs());

  bool sl = couldBeString(l);
  bool sr = couldBeString(r);

  if (bool(sl) != bool(sr)) {
    report(bin, DiagnosticsId::DI_PLUS_STRING);
  }
}